

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_write.c
# Opt level: O2

void write_row_start(xlsxiowriter handle,char *rowattr)

{
  size_t sVar1;
  char *pcVar2;
  uint64_t uVar3;
  undefined4 uVar6;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  sVar1 = handle->rowheight;
  uVar3 = handle->rownr + 1;
  handle->rownr = uVar3;
  handle->colnr = 0;
  uVar6 = (undefined4)(sVar1 >> 0x20);
  if (handle->sheetopen == 0) {
    if (sVar1 == 0) {
      pcVar2 = "";
      if (rowattr != (char *)0x0) {
        pcVar2 = rowattr;
      }
      append_data(&handle->buf,&handle->buflen,"<row%s r=\"%lu\">",pcVar2);
    }
    else {
      auVar5._8_4_ = uVar6;
      auVar5._0_8_ = sVar1;
      auVar5._12_4_ = 0x45300000;
      pcVar2 = "";
      if (rowattr != (char *)0x0) {
        pcVar2 = rowattr;
      }
      append_data(&handle->buf,&handle->buflen,"<row ht=\"%.6G\" customHeight=\"1\"%s r=\"%lu\">",
                  ((auVar5._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * 12.75,pcVar2);
    }
  }
  else if (sVar1 == 0) {
    pcVar2 = "";
    if (rowattr != (char *)0x0) {
      pcVar2 = rowattr;
    }
    fprintf((FILE *)handle->pipe_write,"<row%s r=\"%lu\">",pcVar2,uVar3);
  }
  else {
    auVar4._8_4_ = uVar6;
    auVar4._0_8_ = sVar1;
    auVar4._12_4_ = 0x45300000;
    pcVar2 = "";
    if (rowattr != (char *)0x0) {
      pcVar2 = rowattr;
    }
    fprintf((FILE *)handle->pipe_write,"<row ht=\"%.6G\" customHeight=\"1\"%s r=\"%lu\">",
            ((auVar4._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * 12.75,pcVar2,uVar3);
  }
  handle->rowopen = 1;
  return;
}

Assistant:

void write_row_start (xlsxiowriter handle, const char* rowattr)
{
#ifndef NO_ROW_NUMBERS
  handle->rownr++;
#ifndef NO_COLUMN_NUMBERS
  handle->colnr = 0;
#endif
#endif
  if (handle->sheetopen) {
    if (!handle->rowheight)
      fprintf(handle->pipe_write, "<row%s" ROWNRTAG ">", (rowattr ? rowattr : "") ROWNRPARAM(handle));
    else
      fprintf(handle->pipe_write, "<row ht=\"%.6G\" customHeight=\"1\"%s" ROWNRTAG ">", CALCULATE_COLUMN_HEIGHT(handle->rowheight), (rowattr ? rowattr : "") ROWNRPARAM(handle));
  } else {
    if (!handle->rowheight)
      append_data(&handle->buf, &handle->buflen, "<row%s" ROWNRTAG ">", (rowattr ? rowattr : "") ROWNRPARAM(handle));
    else
      append_data(&handle->buf, &handle->buflen, "<row ht=\"%.6G\" customHeight=\"1\"%s" ROWNRTAG ">",  CALCULATE_COLUMN_HEIGHT(handle->rowheight), (rowattr ? rowattr : "") ROWNRPARAM(handle));
  }
  handle->rowopen = 1;
}